

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FlattenTo2DLayerParams::SerializeWithCachedSizes
          (FlattenTo2DLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FlattenTo2DLayerParams *this_local;
  
  iVar1 = axis(this);
  if (iVar1 != 0) {
    iVar1 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar1,output);
  }
  return;
}

Assistant:

void FlattenTo2DLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FlattenTo2DLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FlattenTo2DLayerParams)
}